

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3SegReaderStep(Fts3Table *p,Fts3MultiSegReader *pCsr)

{
  byte bVar1;
  uint uVar2;
  Fts3SegReader *pFVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  undefined4 uVar12;
  uchar *q;
  ulong uVar13;
  byte *pbVar14;
  uint uVar15;
  ulong uVar16;
  size_t __n;
  long lVar17;
  byte *pbVar18;
  int unaff_EBP;
  ulong uVar19;
  int iVar20;
  int iVar21;
  Fts3SegReader **apSegment;
  char *pEnd;
  byte *pbVar22;
  int nList;
  char *pList;
  int local_c0;
  int local_ac;
  Fts3SegReader **local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  byte *local_80;
  Fts3SegFilter *local_78;
  byte *local_70;
  ulong local_68;
  uint local_5c;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_58;
  ulong local_50;
  Fts3MultiSegReader *local_48;
  char *local_40;
  ulong local_38;
  
  local_88 = (ulong)(uint)pCsr->nSegment;
  local_58 = fts3SegReaderDoclistCmpRev;
  if (p->bDescIdx == '\0') {
    local_58 = fts3SegReaderDoclistCmp;
  }
  if (local_88 == 0) {
    iVar8 = 0;
  }
  else {
    local_78 = pCsr->pFilter;
    apSegment = pCsr->apSegment;
    uVar2 = local_78->flags;
    local_5c = (uVar2 & 0x10) >> 4;
    local_a8 = apSegment;
    local_48 = pCsr;
    local_c0 = unaff_EBP;
    do {
      uVar15 = pCsr->nAdvance;
      uVar16 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        iVar8 = 0;
      }
      else {
        lVar17 = 0;
        iVar8 = 0;
        do {
          pFVar3 = apSegment[lVar17];
          if (pFVar3->bLookup == '\0') {
            iVar8 = fts3SegReaderNext(p,pFVar3,(int)uVar16);
          }
          else {
            fts3SegReaderSetEof(pFVar3);
          }
          if (iVar8 != 0) {
            iVar6 = 1;
            local_c0 = iVar8;
            goto LAB_001cb15b;
          }
          lVar17 = lVar17 + 1;
          uVar15 = pCsr->nAdvance;
          uVar16 = (ulong)(int)uVar15;
        } while (lVar17 < (long)uVar16);
      }
      fts3SegReaderSort(apSegment,(int)local_88,uVar15,fts3SegReaderCmp);
      pCsr->nAdvance = 0;
      pFVar3 = *apSegment;
      iVar6 = 2;
      if (pFVar3->aNode != (char *)0x0) {
        iVar20 = pFVar3->nTerm;
        pCsr->nTerm = iVar20;
        pcVar9 = pFVar3->zTerm;
        pCsr->zTerm = pcVar9;
        if (local_78->zTerm != (char *)0x0 && (char)local_5c == '\0') {
          iVar7 = local_78->nTerm;
          if (((iVar20 < iVar7) || ((uVar2 & 8) == 0 && iVar7 < iVar20)) ||
             (iVar7 = bcmp(pcVar9,local_78->zTerm,(long)iVar7), iVar7 != 0)) goto LAB_001cb15b;
        }
        uVar16 = 1;
        if (1 < (int)local_88) {
          uVar16 = 1;
          do {
            pFVar3 = apSegment[uVar16];
            if (((pFVar3->aNode == (char *)0x0) || (pFVar3->nTerm != iVar20)) ||
               (iVar6 = bcmp(pcVar9,pFVar3->zTerm,(long)iVar20), iVar6 != 0)) goto LAB_001cac0b;
            uVar16 = uVar16 + 1;
          } while (local_88 != uVar16);
          uVar16 = local_88 & 0xffffffff;
        }
LAB_001cac0b:
        iVar6 = (int)uVar16;
        local_68 = uVar16;
        if (((iVar6 == 1) && ((uVar2 & 0x22) == 0)) &&
           ((p->bDescIdx == '\0' || ((*apSegment)->ppNextElem == (Fts3HashElem **)0x0)))) {
          pFVar3 = *apSegment;
          iVar6 = pFVar3->nDoclist;
          pCsr->nDoclist = iVar6;
          if (pFVar3->ppNextElem == (Fts3HashElem **)0x0) {
            pCsr->aDoclist = pFVar3->aDoclist;
          }
          else {
            iVar8 = fts3MsrBufferData(pCsr,pFVar3->aDoclist,iVar6);
            pCsr->aDoclist = pCsr->aBuffer;
          }
          if (iVar8 == 0) {
            iVar8 = 100;
          }
        }
        else {
          local_50 = uVar16 & 0xffffffff;
          uVar16 = 0;
          do {
            fts3SegReaderFirstDocid(p,apSegment[uVar16]);
            uVar16 = uVar16 + 1;
          } while (iVar6 + (uint)(iVar6 == 0) != uVar16);
          fts3SegReaderSort(apSegment,iVar6,iVar6,local_58);
          iVar6 = 0;
          local_98 = 0;
          do {
            pcVar9 = (*apSegment)->pOffsetList;
            if (pcVar9 == (char *)0x0) {
              if (0 < iVar6) {
                pCsr->aDoclist = pCsr->aBuffer;
                pCsr->nDoclist = iVar6;
                iVar8 = 100;
              }
              break;
            }
            local_80 = (byte *)0x0;
            local_ac = 0;
            local_90 = (*apSegment)->iDocid;
            local_40 = pcVar9;
            fts3SegReaderNextDocid(p,*apSegment,(char **)&local_80,&local_ac);
            uVar16 = 1;
            if (1 < (uint)local_68) {
              uVar19 = 1;
              do {
                pFVar3 = apSegment[uVar19];
                uVar16 = uVar19;
                if ((pFVar3->pOffsetList == (char *)0x0) || (pFVar3->iDocid != local_90)) break;
                fts3SegReaderNextDocid(p,pFVar3,(char **)0x0,(int *)0x0);
                uVar19 = uVar19 + 1;
                uVar16 = local_50;
              } while (local_50 != uVar19);
            }
            if ((uVar2 & 4) != 0) {
              fts3ColumnFilter(local_78->iCol,0,(char **)&local_80,&local_ac);
            }
            iVar20 = local_ac;
            if (local_ac < 1 && (uVar2 & 2) != 0) {
LAB_001cb071:
              fts3SegReaderSort(apSegment,(int)local_68,(int)uVar16,local_58);
              bVar4 = true;
            }
            else {
              uVar19 = local_98 - local_90;
              if (iVar6 < 1) {
                uVar19 = local_90 - local_98;
              }
              if (p->bDescIdx == '\0') {
                uVar19 = local_90 - local_98;
              }
              if (((long)uVar19 < 1) && (0 < iVar6 || uVar19 != local_90)) {
                bVar4 = false;
                local_c0 = 0x10b;
              }
              else {
                uVar13 = uVar19;
                iVar7 = iVar6;
                do {
                  iVar7 = iVar7 + 1;
                  bVar4 = 0x7f < uVar13;
                  uVar13 = uVar13 >> 7;
                } while (bVar4);
                iVar7 = (local_ac + 1U & -(uVar2 & 1)) + iVar7;
                __n = (long)local_ac;
                if (pCsr->nBuffer < iVar7) {
                  uVar15 = iVar7 * 2;
                  pCsr->nBuffer = uVar15;
                  local_70 = (byte *)pCsr->aBuffer;
                  local_a0 = (long)local_ac;
                  iVar7 = sqlite3_initialize();
                  if (iVar7 == 0) {
                    if ((int)uVar15 < 1) {
                      uVar15 = 0;
                    }
                    pcVar9 = (char *)sqlite3Realloc(local_70,(ulong)uVar15);
                  }
                  else {
                    pcVar9 = (char *)0x0;
                  }
                  if (pcVar9 == (char *)0x0) {
                    local_c0 = 7;
                    bVar4 = false;
                    goto LAB_001cb069;
                  }
                  pCsr->aBuffer = pcVar9;
                  __n = local_a0;
                }
                lVar17 = (long)iVar6;
                if ((uVar2 & 0x20) == 0) {
                  pbVar22 = (byte *)(pCsr->aBuffer + lVar17);
                  do {
                    pbVar18 = pbVar22;
                    bVar1 = (byte)uVar19;
                    *pbVar18 = bVar1 | 0x80;
                    iVar6 = iVar6 + 1;
                    bVar4 = 0x7f < uVar19;
                    pbVar22 = pbVar18 + 1;
                    uVar19 = uVar19 >> 7;
                  } while (bVar4);
                  *pbVar18 = bVar1;
                  bVar4 = true;
                  if ((uVar2 & 1) != 0) {
                    memcpy(pCsr->aBuffer + iVar6,local_80,__n);
                    iVar7 = iVar20 + iVar6;
                    iVar6 = iVar20 + iVar6 + 1;
                    pCsr->aBuffer[iVar7] = '\0';
                  }
                  local_98 = local_90;
                }
                else {
                  pcVar9 = pCsr->aBuffer;
                  uVar12 = 0;
                  pbVar22 = local_80;
                  if (*local_80 == 1) {
                    local_a0 = (ulong)local_a0._4_4_ << 0x20;
                    iVar20 = 0;
                  }
                  else {
                    iVar20 = 0;
                    if (*local_80 == 2) {
                      lVar11 = 0;
                      uVar13 = uVar19;
                      do {
                        lVar10 = lVar11;
                        bVar1 = (byte)uVar13;
                        pcVar9[lVar10 + lVar17] = bVar1 | 0x80;
                        lVar11 = lVar10 + 1;
                        bVar4 = 0x7f < uVar13;
                        uVar13 = uVar13 >> 7;
                      } while (bVar4);
                      pcVar9[lVar11 + lVar17 + -1] = bVar1;
                      iVar20 = (int)lVar10 + 2;
                      pcVar9[lVar11 + lVar17] = '\x02';
                      uVar12 = 1;
                    }
                    local_a0 = CONCAT44(local_a0._4_4_,uVar12);
                    bVar1 = *local_80;
                    if (1 < bVar1) {
                      do {
                        bVar5 = bVar1 & 0x80;
                        bVar1 = pbVar22[1];
                        pbVar22 = pbVar22 + 1;
                      } while ((bVar1 & 0xfe) != 0 || bVar5 != 0);
                    }
                  }
                  pbVar18 = local_80 + __n;
                  if (pbVar22 < local_80 + __n) {
                    do {
                      local_70 = pbVar18;
                      iVar7 = sqlite3Fts3GetVarint((char *)(pbVar22 + 1),(sqlite_int64 *)&local_38);
                      if (pbVar22[(long)iVar7 + 1] == 2) {
                        if ((int)local_a0 == 0) {
                          pbVar18 = (byte *)(pcVar9 + iVar20 + lVar17);
                          uVar13 = uVar19;
                          do {
                            pbVar14 = pbVar18;
                            bVar1 = (byte)uVar13;
                            *pbVar14 = bVar1 | 0x80;
                            iVar20 = iVar20 + 1;
                            bVar4 = 0x7f < uVar13;
                            pbVar18 = pbVar14 + 1;
                            uVar13 = uVar13 >> 7;
                          } while (bVar4);
                          *pbVar14 = bVar1;
                        }
                        pcVar9[iVar20 + lVar17] = '\x01';
                        pbVar18 = (byte *)(pcVar9 + (iVar20 + 1) + lVar17);
                        uVar13 = local_38;
                        iVar21 = iVar20 + 1;
                        do {
                          iVar20 = iVar21;
                          pbVar14 = pbVar18;
                          bVar1 = (byte)uVar13;
                          *pbVar14 = bVar1 | 0x80;
                          iVar21 = iVar20 + 1;
                          bVar4 = 0x7f < uVar13;
                          pbVar18 = pbVar14 + 1;
                          uVar13 = uVar13 >> 7;
                        } while (bVar4);
                        *pbVar14 = bVar1;
                        iVar20 = iVar20 + 2;
                        pcVar9[iVar21 + lVar17] = '\x02';
                        local_a0 = CONCAT44(local_a0._4_4_,1);
                      }
                      pbVar22 = pbVar22 + (long)iVar7 + 1;
                      bVar1 = *pbVar22;
                      if (1 < bVar1) {
                        do {
                          bVar5 = bVar1 & 0x80;
                          bVar1 = pbVar22[1];
                          pbVar22 = pbVar22 + 1;
                        } while ((bVar1 & 0xfe) != 0 || bVar5 != 0);
                      }
                      pbVar18 = local_70;
                    } while (pbVar22 < local_70);
                  }
                  if ((int)local_a0 != 0) {
                    lVar11 = (long)iVar20;
                    iVar20 = iVar20 + 1;
                    pcVar9[lVar11 + lVar17] = '\0';
                  }
                  iVar6 = iVar6 + iVar20;
                  if (iVar20 != 0) {
                    local_98 = local_90;
                  }
                  bVar4 = true;
                  pCsr = local_48;
                }
              }
LAB_001cb069:
              apSegment = local_a8;
              if (bVar4) goto LAB_001cb071;
              bVar4 = false;
            }
            pcVar9 = local_40;
          } while (bVar4);
          iVar6 = 1;
          if (pcVar9 != (char *)0x0) goto LAB_001cb15b;
        }
        pCsr->nAdvance = (int)local_68;
        iVar6 = 0;
      }
LAB_001cb15b:
      if (iVar6 != 0) {
        if (iVar6 == 2) {
          return iVar8;
        }
        return local_c0;
      }
    } while (iVar8 == 0);
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SegReaderStep(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr        /* Cursor object */
){
  int rc = SQLITE_OK;

  int isIgnoreEmpty =  (pCsr->pFilter->flags & FTS3_SEGMENT_IGNORE_EMPTY);
  int isRequirePos =   (pCsr->pFilter->flags & FTS3_SEGMENT_REQUIRE_POS);
  int isColFilter =    (pCsr->pFilter->flags & FTS3_SEGMENT_COLUMN_FILTER);
  int isPrefix =       (pCsr->pFilter->flags & FTS3_SEGMENT_PREFIX);
  int isScan =         (pCsr->pFilter->flags & FTS3_SEGMENT_SCAN);
  int isFirst =        (pCsr->pFilter->flags & FTS3_SEGMENT_FIRST);

  Fts3SegReader **apSegment = pCsr->apSegment;
  int nSegment = pCsr->nSegment;
  Fts3SegFilter *pFilter = pCsr->pFilter;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( pCsr->nSegment==0 ) return SQLITE_OK;

  do {
    int nMerge;
    int i;
  
    /* Advance the first pCsr->nAdvance entries in the apSegment[] array
    ** forward. Then sort the list in order of current term again.  
    */
    for(i=0; i<pCsr->nAdvance; i++){
      Fts3SegReader *pSeg = apSegment[i];
      if( pSeg->bLookup ){
        fts3SegReaderSetEof(pSeg);
      }else{
        rc = fts3SegReaderNext(p, pSeg, 0);
      }
      if( rc!=SQLITE_OK ) return rc;
    }
    fts3SegReaderSort(apSegment, nSegment, pCsr->nAdvance, fts3SegReaderCmp);
    pCsr->nAdvance = 0;

    /* If all the seg-readers are at EOF, we're finished. return SQLITE_OK. */
    assert( rc==SQLITE_OK );
    if( apSegment[0]->aNode==0 ) break;

    pCsr->nTerm = apSegment[0]->nTerm;
    pCsr->zTerm = apSegment[0]->zTerm;

    /* If this is a prefix-search, and if the term that apSegment[0] points
    ** to does not share a suffix with pFilter->zTerm/nTerm, then all 
    ** required callbacks have been made. In this case exit early.
    **
    ** Similarly, if this is a search for an exact match, and the first term
    ** of segment apSegment[0] is not a match, exit early.
    */
    if( pFilter->zTerm && !isScan ){
      if( pCsr->nTerm<pFilter->nTerm 
       || (!isPrefix && pCsr->nTerm>pFilter->nTerm)
       || memcmp(pCsr->zTerm, pFilter->zTerm, pFilter->nTerm) 
      ){
        break;
      }
    }

    nMerge = 1;
    while( nMerge<nSegment 
        && apSegment[nMerge]->aNode
        && apSegment[nMerge]->nTerm==pCsr->nTerm 
        && 0==memcmp(pCsr->zTerm, apSegment[nMerge]->zTerm, pCsr->nTerm)
    ){
      nMerge++;
    }

    assert( isIgnoreEmpty || (isRequirePos && !isColFilter) );
    if( nMerge==1 
     && !isIgnoreEmpty 
     && !isFirst 
     && (p->bDescIdx==0 || fts3SegReaderIsPending(apSegment[0])==0)
    ){
      pCsr->nDoclist = apSegment[0]->nDoclist;
      if( fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pCsr, apSegment[0]->aDoclist, pCsr->nDoclist);
        pCsr->aDoclist = pCsr->aBuffer;
      }else{
        pCsr->aDoclist = apSegment[0]->aDoclist;
      }
      if( rc==SQLITE_OK ) rc = SQLITE_ROW;
    }else{
      int nDoclist = 0;           /* Size of doclist */
      sqlite3_int64 iPrev = 0;    /* Previous docid stored in doclist */

      /* The current term of the first nMerge entries in the array
      ** of Fts3SegReader objects is the same. The doclists must be merged
      ** and a single term returned with the merged doclist.
      */
      for(i=0; i<nMerge; i++){
        fts3SegReaderFirstDocid(p, apSegment[i]);
      }
      fts3SegReaderSort(apSegment, nMerge, nMerge, xCmp);
      while( apSegment[0]->pOffsetList ){
        int j;                    /* Number of segments that share a docid */
        char *pList = 0;
        int nList = 0;
        int nByte;
        sqlite3_int64 iDocid = apSegment[0]->iDocid;
        fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
        j = 1;
        while( j<nMerge
            && apSegment[j]->pOffsetList
            && apSegment[j]->iDocid==iDocid
        ){
          fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
          j++;
        }

        if( isColFilter ){
          fts3ColumnFilter(pFilter->iCol, 0, &pList, &nList);
        }

        if( !isIgnoreEmpty || nList>0 ){

          /* Calculate the 'docid' delta value to write into the merged 
          ** doclist. */
          sqlite3_int64 iDelta;
          if( p->bDescIdx && nDoclist>0 ){
            iDelta = iPrev - iDocid;
          }else{
            iDelta = iDocid - iPrev;
          }
          if( iDelta<=0 && (nDoclist>0 || iDelta!=iDocid) ){
            return FTS_CORRUPT_VTAB;
          }
          assert( nDoclist>0 || iDelta==iDocid );

          nByte = sqlite3Fts3VarintLen(iDelta) + (isRequirePos?nList+1:0);
          if( nDoclist+nByte>pCsr->nBuffer ){
            char *aNew;
            pCsr->nBuffer = (nDoclist+nByte)*2;
            aNew = sqlite3_realloc(pCsr->aBuffer, pCsr->nBuffer);
            if( !aNew ){
              return SQLITE_NOMEM;
            }
            pCsr->aBuffer = aNew;
          }

          if( isFirst ){
            char *a = &pCsr->aBuffer[nDoclist];
            int nWrite;
           
            nWrite = sqlite3Fts3FirstFilter(iDelta, pList, nList, a);
            if( nWrite ){
              iPrev = iDocid;
              nDoclist += nWrite;
            }
          }else{
            nDoclist += sqlite3Fts3PutVarint(&pCsr->aBuffer[nDoclist], iDelta);
            iPrev = iDocid;
            if( isRequirePos ){
              memcpy(&pCsr->aBuffer[nDoclist], pList, nList);
              nDoclist += nList;
              pCsr->aBuffer[nDoclist++] = '\0';
            }
          }
        }

        fts3SegReaderSort(apSegment, nMerge, j, xCmp);
      }
      if( nDoclist>0 ){
        pCsr->aDoclist = pCsr->aBuffer;
        pCsr->nDoclist = nDoclist;
        rc = SQLITE_ROW;
      }
    }
    pCsr->nAdvance = nMerge;
  }while( rc==SQLITE_OK );

  return rc;
}